

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

ElementTypeAndOffset * __thiscall
choc::value::Type::ComplexArray::getElementInfo
          (ElementTypeAndOffset *__return_storage_ptr__,ComplexArray *this,uint32_t index)

{
  RepeatedGroup *pRVar1;
  size_t sVar2;
  size_t elementSize;
  RepeatedGroup *g;
  RepeatedGroup *__end2;
  RepeatedGroup *__begin2;
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *__range2;
  size_t offset;
  uint32_t index_local;
  ComplexArray *this_local;
  
  __range2 = (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)0x0;
  __end2 = AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::begin(&this->groups);
  pRVar1 = AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::end(&this->groups);
  offset._4_4_ = index;
  while( true ) {
    if (__end2 == pRVar1) {
      throwError("Index out of range");
    }
    sVar2 = Type::getValueDataSize(&__end2->elementType);
    if (offset._4_4_ < __end2->repetitions) break;
    offset._4_4_ = offset._4_4_ - __end2->repetitions;
    __range2 = (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
               ((long)&__range2->items + sVar2 * __end2->repetitions);
    __end2 = __end2 + 1;
  }
  Type(&__return_storage_ptr__->elementType,&__end2->elementType);
  __return_storage_ptr__->offset = (size_t)((long)&__range2->items + sVar2 * offset._4_4_);
  return __return_storage_ptr__;
}

Assistant:

ElementTypeAndOffset getElementInfo (uint32_t index) const
    {
        size_t offset = 0;

        for (auto& g : groups)
        {
            auto elementSize = g.elementType.getValueDataSize();

            if (index < g.repetitions)
                return { g.elementType, offset + elementSize * index };

            index -= g.repetitions;
            offset += elementSize * g.repetitions;
        }

        throwError ("Index out of range");
    }